

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O0

void P_AlignPlane(sector_t *sec,line_t *line,int which)

{
  double bb;
  double dVar1;
  double this;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_1a8;
  double local_1a0;
  double *local_198;
  sector_t *local_190;
  double dist;
  TVector3<double> local_140;
  TVector3<double> local_128;
  undefined1 local_110 [32];
  double local_f0;
  double destheight;
  double srcheight;
  secplane_t *srcplane;
  DVector3 cross;
  DVector3 v2;
  DVector3 v1;
  DVector3 p;
  double local_70;
  undefined1 local_68 [24];
  vertex_t *vert;
  double dist_1;
  line_t **probe;
  vertex_t *pvStack_38;
  int i;
  vertex_t *refvert;
  double bestdist;
  sector_t *refsec;
  side_t *psStack_18;
  int which_local;
  line_t *line_local;
  sector_t *sec_local;
  
  pvStack_38 = (*sec->lines)->v1;
  if (line->backsector != (sector_t *)0x0) {
    refvert = (vertex_t *)0x0;
    dist_1 = (double)sec->lines;
    refsec._4_4_ = which;
    psStack_18 = (side_t *)line;
    line_local = (line_t *)sec;
    for (probe._4_4_ = (int)sec->linecount << 1; 0 < (int)probe._4_4_; probe._4_4_ = probe._4_4_ - 1
        ) {
      if ((probe._4_4_ & 1) == 0) {
        local_68._16_8_ = **(undefined8 **)dist_1;
      }
      else {
        local_68._16_8_ = *(undefined8 *)(*(long *)dist_1 + 8);
        dist_1 = (double)((long)dist_1 + 8);
      }
      dVar3 = vertex_t::fY((vertex_t *)psStack_18->sector);
      dVar4 = vertex_t::fY((vertex_t *)local_68._16_8_);
      line_t::Delta((line_t *)local_68);
      dVar3 = (dVar3 - dVar4) * (double)local_68._0_8_;
      dVar4 = vertex_t::fX((vertex_t *)psStack_18->sector);
      dVar5 = vertex_t::fX((vertex_t *)local_68._16_8_);
      line_t::Delta((line_t *)&p.Z);
      vert = (vertex_t *)ABS(dVar3 - (dVar4 - dVar5) * local_70);
      if ((double)refvert < (double)vert) {
        pvStack_38 = (vertex_t *)local_68._16_8_;
        refvert = vert;
      }
    }
    if ((sector_t *)psStack_18->textures[2].yOffset == (sector_t *)line_local) {
      local_190 = (sector_t *)psStack_18->textures[2].xScale;
    }
    else {
      local_190 = (sector_t *)psStack_18->textures[2].yOffset;
    }
    bestdist = (double)local_190;
    TVector3<double>::TVector3((TVector3<double> *)&v1.Z);
    TVector3<double>::TVector3((TVector3<double> *)&v2.Z);
    TVector3<double>::TVector3((TVector3<double> *)&cross.Z);
    TVector3<double>::TVector3((TVector3<double> *)&srcplane);
    if (refsec._4_4_ == 0) {
      local_198 = &line_local[1].delta.Y;
    }
    else {
      local_198 = &line_local[1].alpha;
    }
    srcheight = (double)local_198;
    if (refsec._4_4_ == 0) {
      local_1a0 = sector_t::GetPlaneTexZ((sector_t *)line_local,0);
    }
    else {
      local_1a0 = sector_t::GetPlaneTexZ((sector_t *)line_local,1);
    }
    destheight = local_1a0;
    if (refsec._4_4_ == 0) {
      local_1a8 = sector_t::GetPlaneTexZ((sector_t *)bestdist,0);
    }
    else {
      local_1a8 = sector_t::GetPlaneTexZ((sector_t *)bestdist,1);
    }
    local_f0 = local_1a8;
    dVar3 = vertex_t::fX((vertex_t *)psStack_18->sector);
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&v1.Z,0);
    *pdVar2 = dVar3;
    dVar4 = vertex_t::fY((vertex_t *)psStack_18->sector);
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&v1.Z,1);
    dVar3 = local_f0;
    *pdVar2 = dVar4;
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&v1.Z,2);
    *pdVar2 = dVar3;
    line_t::Delta((line_t *)(local_110 + 0x10));
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&v2.Z,0);
    *pdVar2 = (double)local_110._16_8_;
    line_t::Delta((line_t *)local_110);
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&v2.Z,1);
    *pdVar2 = (double)local_110._8_8_;
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&v2.Z,2);
    *pdVar2 = 0.0;
    dVar3 = vertex_t::fX(pvStack_38);
    dVar4 = vertex_t::fX((vertex_t *)psStack_18->sector);
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&cross.Z,0);
    *pdVar2 = dVar3 - dVar4;
    dVar3 = vertex_t::fY(pvStack_38);
    dVar4 = vertex_t::fY((vertex_t *)psStack_18->sector);
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&cross.Z,1);
    *pdVar2 = dVar3 - dVar4;
    dVar3 = destheight - local_f0;
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&cross.Z,2);
    *pdVar2 = dVar3;
    TVector3<double>::operator^(&local_140,(TVector3<double> *)&v2.Z,(TVector3<double> *)&cross.Z);
    TVector3<double>::Unit(&local_128,&local_140);
    TVector3<double>::operator=((TVector3<double> *)&srcplane,&local_128);
    if (((cross.Y < 0.0) && (refsec._4_4_ == 0)) || ((0.0 < cross.Y && (refsec._4_4_ == 1)))) {
      TVector3<double>::operator-((TVector3<double> *)&dist,(TVector3<double> *)&srcplane);
      TVector3<double>::operator=((TVector3<double> *)&srcplane,(TVector3<double> *)&dist);
    }
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&srcplane,0);
    dVar3 = *pdVar2;
    dVar6 = vertex_t::fX((vertex_t *)psStack_18->sector);
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&srcplane,1);
    dVar4 = *pdVar2;
    dVar7 = vertex_t::fY((vertex_t *)psStack_18->sector);
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&srcplane,2);
    this = srcheight;
    dVar1 = *pdVar2 * local_f0;
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&srcplane,0);
    dVar5 = *pdVar2;
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&srcplane,1);
    bb = *pdVar2;
    pdVar2 = TVector3<double>::operator[]((TVector3<double> *)&srcplane,2);
    secplane_t::set((secplane_t *)this,dVar5,bb,*pdVar2,(-dVar3 * dVar6 - dVar4 * dVar7) - dVar1);
  }
  return;
}

Assistant:

static void P_AlignPlane(sector_t *sec, line_t *line, int which)
{
	sector_t *refsec;
	double bestdist;
	vertex_t *refvert = (*sec->lines)->v1;	// Shut up, GCC
	int i;
	line_t **probe;

	if (line->backsector == NULL)
		return;

	// Find furthest vertex from the reference line. It, along with the two ends
	// of the line, will define the plane.
	bestdist = 0;
	for (i = sec->linecount * 2, probe = sec->lines; i > 0; i--)
	{
		double dist;
		vertex_t *vert;

		if (i & 1)
			vert = (*probe++)->v2;
		else
			vert = (*probe)->v1;
		dist = fabs((line->v1->fY() - vert->fY()) * line->Delta().X -
			(line->v1->fX() - vert->fX()) * line->Delta().Y);

		if (dist > bestdist)
		{
			bestdist = dist;
			refvert = vert;
		}
	}

	refsec = line->frontsector == sec ? line->backsector : line->frontsector;

	DVector3 p, v1, v2, cross;

	secplane_t *srcplane;
	double srcheight, destheight;

	srcplane = (which == 0) ? &sec->floorplane : &sec->ceilingplane;
	srcheight = (which == 0) ? sec->GetPlaneTexZ(sector_t::floor) : sec->GetPlaneTexZ(sector_t::ceiling);
	destheight = (which == 0) ? refsec->GetPlaneTexZ(sector_t::floor) : refsec->GetPlaneTexZ(sector_t::ceiling);

	p[0] = line->v1->fX();
	p[1] = line->v1->fY();
	p[2] = destheight;
	v1[0] = line->Delta().X;
	v1[1] = line->Delta().Y;
	v1[2] = 0;
	v2[0] = refvert->fX() - line->v1->fX();
	v2[1] = refvert->fY() - line->v1->fY();
	v2[2] = srcheight - destheight;

	cross = (v1 ^ v2).Unit();

	// Fix backward normals
	if ((cross.Z < 0 && which == 0) || (cross.Z > 0 && which == 1))
	{
		cross = -cross;
	}

	double dist = -cross[0] * line->v1->fX() - cross[1] * line->v1->fY() - cross[2] * destheight;
	srcplane->set(cross[0], cross[1], cross[2], dist);
}